

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopwave.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  char name [32];
  
  iVar2 = SDL_Init(0x10);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    uVar3 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t initialize SDL: %s\n",uVar3);
    return 1;
  }
  if (argc < 2) {
    pcVar5 = "sample.wav";
  }
  else {
    pcVar5 = argv[1];
  }
  uVar3 = SDL_RWFromFile(pcVar5,"rb");
  lVar4 = SDL_LoadWAV_RW(uVar3,1,&wave,0x1040d8,0x1040e0);
  pFVar1 = _stderr;
  if (lVar4 == 0) {
    uVar3 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t load %s: %s\n",pcVar5,uVar3);
    iVar2 = 1;
  }
  else {
    wave.spec.callback = fillerup;
    signal(1,poked);
    signal(2,poked);
    signal(3,poked);
    signal(0xf,poked);
    iVar2 = SDL_OpenAudio(&wave,0);
    pFVar1 = _stderr;
    if (-1 < iVar2) {
      SDL_PauseAudio(0);
      uVar3 = SDL_AudioDriverName(name,0x20);
      printf("Using audio driver: %s\n",uVar3);
      while ((done == '\0' && (iVar2 = SDL_GetAudioStatus(), iVar2 == 1))) {
        SDL_Delay(1000);
      }
      SDL_CloseAudio();
      SDL_FreeWAV(wave.sound);
      SDL_Quit();
      return 0;
    }
    uVar3 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t open audio: %s\n",uVar3);
    SDL_FreeWAV(wave.sound);
    iVar2 = 2;
  }
  quit(iVar2);
  return extraout_EAX;
}

Assistant:

int main(int argc, char *argv[])
{
	char name[32];
	const char *file;

	/* Load the SDL library */
	if ( SDL_Init(SDL_INIT_AUDIO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}
	file = (argc < 2) ? "sample.wav" : argv[1];
	/* Load the wave file into memory */
	if ( SDL_LoadWAV(file, &wave.spec, &wave.sound, &wave.soundlen) == NULL ) {
		fprintf(stderr, "Couldn't load %s: %s\n", file, SDL_GetError());
		quit(1);
	}

	wave.spec.callback = fillerup;
#if HAVE_SIGNAL_H
	/* Set the signals */
#ifdef SIGHUP
	signal(SIGHUP, poked);
#endif
	signal(SIGINT, poked);
#ifdef SIGQUIT
	signal(SIGQUIT, poked);
#endif
	signal(SIGTERM, poked);
#endif /* HAVE_SIGNAL_H */

	/* Initialize fillerup() variables */
	if ( SDL_OpenAudio(&wave.spec, NULL) < 0 ) {
		fprintf(stderr, "Couldn't open audio: %s\n", SDL_GetError());
		SDL_FreeWAV(wave.sound);
		quit(2);
	}
	SDL_PauseAudio(0);

	/* Let the audio run */
	printf("Using audio driver: %s\n", SDL_AudioDriverName(name, 32));
	while ( ! done && (SDL_GetAudioStatus() == SDL_AUDIO_PLAYING) )
		SDL_Delay(1000);

	/* Clean up on signal */
	SDL_CloseAudio();
	SDL_FreeWAV(wave.sound);
	SDL_Quit();
	return(0);
}